

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_invalid_flags(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  uv_tcp_t server;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&addr,1);
      if (iVar1 == -0x16) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uVar2 = 200;
      }
      else {
        pcVar3 = "r == UV_EINVAL";
        uVar2 = 0xc6;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0xc4;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0xc1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_invalid_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, UV_TCP_IPV6ONLY);
  ASSERT(r == UV_EINVAL);

  MAKE_VALGRIND_HAPPY();
  return 0;
}